

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

int Abc_NtkIsAcyclic_rec(Abc_Obj_t *pNode)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  int Fill;
  int Fill_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  undefined8 in_RDX;
  int *piVar9;
  void **ppvVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar11;
  char *__format;
  FILE *pFVar12;
  long lVar13;
  Abc_Obj_t *pAVar14;
  bool bVar15;
  
  uVar5 = *(uint *)&pNode->field_0x14 & 0xf;
  if ((uVar5 != 2) && (uVar5 != 5)) {
    if (uVar5 == 6) {
      __assert_fail("!Abc_ObjIsNet(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                    ,0x5ff,"int Abc_NtkIsAcyclic_rec(Abc_Obj_t *)");
    }
    bVar15 = (*(uint *)&pNode->field_0x14 & 0xe) == 8;
    piVar9 = (int *)CONCAT71((int7)((ulong)in_RDX >> 8),uVar5 == 10 || bVar15);
    if (uVar5 != 10 && !bVar15) {
      pAVar2 = pNode->pNtk;
      if (pAVar2->ntkType == ABC_NTK_STRASH) {
        piVar9 = *(int **)((ulong)pNode & 0xfffffffffffffffe);
        if (*piVar9 != 3) {
          __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                        ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
        }
        if ((*(uint *)((long)((ulong)pNode & 0xfffffffffffffffe) + 0x14) & 0xf) == 1) {
          return 1;
        }
      }
      if (uVar5 != 7) {
        __assert_fail("Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                      ,0x602,"int Abc_NtkIsAcyclic_rec(Abc_Obj_t *)");
      }
      iVar7 = pNode->Id;
      Vec_IntFillExtra(&pAVar2->vTravIds,iVar7 + 1,(int)piVar9);
      if ((-1 < (long)iVar7) && (iVar7 < (pAVar2->vTravIds).nSize)) {
        pAVar3 = pNode->pNtk;
        if ((pAVar2->vTravIds).pArray[iVar7] == pAVar3->nTravIds + -1) {
          __assert_fail("!Abc_NodeIsTravIdPrevious(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                        ,0x604,"int Abc_NtkIsAcyclic_rec(Abc_Obj_t *)");
        }
        iVar7 = pNode->Id;
        Vec_IntFillExtra(&pAVar3->vTravIds,iVar7 + 1,Fill);
        if ((-1 < (long)iVar7) && (iVar7 < (pAVar3->vTravIds).nSize)) {
          pAVar4 = pNode->pNtk;
          iVar6 = pAVar4->nTravIds;
          if ((pAVar3->vTravIds).pArray[iVar7] == iVar6) {
            fprintf(_stdout,"Network \"%s\" contains combinational loop!\n",pAVar2->pName);
            pFVar12 = _stdout;
            pcVar8 = Abc_ObjName(pNode);
            __format = "Node \"%s\" is encountered twice on the following path to the COs:\n";
LAB_00850688:
            fprintf(pFVar12,__format,pcVar8);
            return 0;
          }
          iVar7 = pNode->Id;
          Vec_IntFillExtra(&pAVar4->vTravIds,iVar7 + 1,Fill_00);
          if ((-1 < (long)iVar7) && (iVar7 < (pAVar4->vTravIds).nSize)) {
            (pAVar4->vTravIds).pArray[iVar7] = iVar6;
            iVar7 = extraout_EDX;
            if (0 < (pNode->vFanins).nSize) {
              lVar13 = 0;
              do {
                ppvVar10 = pNode->pNtk->vObjs->pArray;
                pAVar14 = (Abc_Obj_t *)ppvVar10[(pNode->vFanins).pArray[lVar13]];
                if (pAVar14->pNtk->ntkType == ABC_NTK_NETLIST) {
                  ppvVar10 = (void **)(long)*(pAVar14->vFanins).pArray;
                  pAVar14 = (Abc_Obj_t *)pAVar14->pNtk->vObjs->pArray[(long)ppvVar10];
                }
                pAVar2 = pAVar14->pNtk;
                if (pAVar2 != pNode->pNtk) {
                  __assert_fail("pFanin->pNtk == pNode->pNtk",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                                ,0x613,"int Abc_NtkIsAcyclic_rec(Abc_Obj_t *)");
                }
                iVar6 = pAVar14->Id;
                Vec_IntFillExtra(&pAVar2->vTravIds,iVar6 + 1,(int)ppvVar10);
                if (((long)iVar6 < 0) || ((pAVar2->vTravIds).nSize <= iVar6)) goto LAB_008508a6;
                iVar7 = extraout_EDX_00;
                if (((pAVar2->vTravIds).pArray[iVar6] != pAVar14->pNtk->nTravIds + -1) &&
                   (iVar6 = Abc_NtkIsAcyclic_rec(pAVar14), pFVar12 = _stdout,
                   iVar7 = extraout_EDX_01, iVar6 == 0)) {
                  pcVar8 = Abc_ObjName(pAVar14);
                  __format = " %s ->";
                  goto LAB_00850688;
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 < (pNode->vFanins).nSize);
            }
            if (pNode->pNtk->ntkType == ABC_NTK_STRASH) {
              iVar6 = Abc_AigNodeIsChoice(pNode);
              iVar7 = (int)extraout_RDX;
              if (iVar6 != 0) {
                uVar11 = extraout_RDX;
                for (pAVar14 = (Abc_Obj_t *)(pNode->field_5).pData; iVar7 = (int)uVar11,
                    pAVar14 != (Abc_Obj_t *)0x0; pAVar14 = (Abc_Obj_t *)(pAVar14->field_5).pData) {
                  pAVar2 = pAVar14->pNtk;
                  iVar6 = pAVar14->Id;
                  Vec_IntFillExtra(&pAVar2->vTravIds,iVar6 + 1,iVar7);
                  if (((long)iVar6 < 0) || ((pAVar2->vTravIds).nSize <= iVar6)) goto LAB_008508a6;
                  uVar11 = extraout_RDX_00;
                  if (((pAVar2->vTravIds).pArray[iVar6] != pAVar14->pNtk->nTravIds + -1) &&
                     (iVar7 = Abc_NtkIsAcyclic_rec(pAVar14), pFVar12 = _stdout,
                     uVar11 = extraout_RDX_01, iVar7 == 0)) {
                    pcVar8 = Abc_ObjName(pAVar14);
                    fprintf(pFVar12," %s",pcVar8);
                    pFVar12 = _stdout;
                    pcVar8 = Abc_ObjName(pNode);
                    __format = " (choice of %s) -> ";
                    goto LAB_00850688;
                  }
                }
              }
            }
            pAVar2 = pNode->pNtk;
            iVar6 = pAVar2->nTravIds;
            iVar1 = pNode->Id;
            Vec_IntFillExtra(&pAVar2->vTravIds,iVar1 + 1,iVar7);
            if ((-1 < (long)iVar1) && (iVar1 < (pAVar2->vTravIds).nSize)) {
              (pAVar2->vTravIds).pArray[iVar1] = iVar6 + -1;
              return 1;
            }
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
      }
LAB_008508a6:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  return 1;
}

Assistant:

int Abc_NtkIsAcyclic_rec( Abc_Obj_t * pNode )
{
    Abc_Ntk_t * pNtk = pNode->pNtk;
    Abc_Obj_t * pFanin;
    int fAcyclic, i;
    assert( !Abc_ObjIsNet(pNode) );
    if ( Abc_ObjIsCi(pNode) || Abc_ObjIsBox(pNode) || (Abc_NtkIsStrash(pNode->pNtk) && Abc_AigNodeIsConst(pNode)) )
        return 1;
    assert( Abc_ObjIsNode(pNode) );
    // make sure the node is not visited
    assert( !Abc_NodeIsTravIdPrevious(pNode) );
    // check if the node is part of the combinational loop
    if ( Abc_NodeIsTravIdCurrent(pNode) )
    {
        fprintf( stdout, "Network \"%s\" contains combinational loop!\n", Abc_NtkName(pNtk) );
        fprintf( stdout, "Node \"%s\" is encountered twice on the following path to the COs:\n", Abc_ObjName(pNode) );
        return 0;
    }
    // mark this node as a node on the current path
    Abc_NodeSetTravIdCurrent( pNode );
    // visit the transitive fanin
    Abc_ObjForEachFanin( pNode, pFanin, i )
    { 
        pFanin = Abc_ObjFanin0Ntk(pFanin);
        // make sure there is no mixing of networks
        assert( pFanin->pNtk == pNode->pNtk );
        // check if the fanin is visited
        if ( Abc_NodeIsTravIdPrevious(pFanin) ) 
            continue;
        // traverse the fanin's cone searching for the loop
        if ( (fAcyclic = Abc_NtkIsAcyclic_rec(pFanin)) )
            continue;
        // return as soon as the loop is detected
        fprintf( stdout, " %s ->", Abc_ObjName(pFanin) );
        return 0;
    }
    // visit choices
    if ( Abc_NtkIsStrash(pNode->pNtk) && Abc_AigNodeIsChoice(pNode) )
    {
        for ( pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
        {
            // check if the fanin is visited
            if ( Abc_NodeIsTravIdPrevious(pFanin) ) 
                continue;
            // traverse the fanin's cone searching for the loop
            if ( (fAcyclic = Abc_NtkIsAcyclic_rec(pFanin)) )
                continue;
            // return as soon as the loop is detected
            fprintf( stdout, " %s", Abc_ObjName(pFanin) );
            fprintf( stdout, " (choice of %s) -> ", Abc_ObjName(pNode) );
            return 0;
        }
    }
    // mark this node as a visited node
    Abc_NodeSetTravIdPrevious( pNode );
    return 1;
}